

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> * __thiscall
jsoncons::jmespath::
eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::
create_json<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
          (eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
           *this,basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *args)

{
  _Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_false>
  this_00;
  __single_object temp;
  __uniq_ptr_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
  local_20;
  
  this_00._M_head_impl =
       (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
       operator_new(0x10);
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
            (this_00._M_head_impl,args);
  local_20._M_t.
  super__Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
        )(tuple<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
          )this_00._M_head_impl;
  std::
  vector<std::unique_ptr<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>,std::allocator<std::unique_ptr<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
  ::
  emplace_back<std::unique_ptr<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
            (*(vector<std::unique_ptr<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>,std::allocator<std::unique_ptr<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
               **)this,
             (unique_ptr<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
              *)&local_20);
  if ((_Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
       )local_20._M_t.
        super__Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::operator()((default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)&local_20,
                 (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 local_20._M_t.
                 super__Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
  }
  return (_Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_false>
          )this_00._M_head_impl;
}

Assistant:

Json* create_json(Args&& ... args)
        {
            auto temp = jsoncons::make_unique<Json>(std::forward<Args>(args)...);
            Json* ptr = temp.get();
            temp_storage_.push_back(std::move(temp));
            return ptr;
        }